

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

qsizetype __thiscall
QStaticByteArrayMatcherBase::indexOfIn
          (QStaticByteArrayMatcherBase *this,char *needle,size_t nlen,char *haystack,qsizetype hlen,
          qsizetype from)

{
  qsizetype qVar1;
  
  qVar1 = 0;
  if (0 < from) {
    qVar1 = from;
  }
  qVar1 = bm_find((uchar *)haystack,hlen,qVar1,(uchar *)needle,nlen,(uchar *)this);
  return qVar1;
}

Assistant:

qsizetype QStaticByteArrayMatcherBase::indexOfIn(const char *needle, size_t nlen, const char *haystack, qsizetype hlen, qsizetype from) const noexcept
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(haystack), hlen, from,
                   reinterpret_cast<const uchar *>(needle),   nlen, m_skiptable.data);
}